

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

date_t duckdb::TryCastCInternal<short,duckdb::date_t,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  date_t result_value;
  date_t local_c;
  
  bVar1 = TryCast::Operation<short,duckdb::date_t>
                    (*(short *)((long)result->deprecated_columns[col].deprecated_data + row * 2),
                     &local_c,false);
  if (!bVar1) {
    local_c = FetchDefaultValue::Operation<duckdb::date_t>();
  }
  return (date_t)local_c.days;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}